

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O3

vector<RPCResult,_std::allocator<RPCResult>_> *
DecodeTxDoc(vector<RPCResult,_std::allocator<RPCResult>_> *__return_storage_ptr__,
           string *txid_field_doc)

{
  pointer pcVar1;
  long *plVar2;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  string m_key_name_10;
  string m_key_name_11;
  string m_key_name_12;
  string m_key_name_13;
  string m_key_name_14;
  string m_key_name_15;
  string m_key_name_16;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_16;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_17;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_18;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_19;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_20;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_21;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  long *plVar8;
  long lVar9;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<RPCResult> __l_05;
  undefined4 in_stack_ffffffffffffeb08;
  undefined4 uVar10;
  undefined1 in_stack_ffffffffffffeb0c [28];
  string in_stack_ffffffffffffeb28;
  pointer in_stack_ffffffffffffeb48;
  pointer pRVar11;
  pointer in_stack_ffffffffffffeb50;
  pointer pRVar12;
  pointer in_stack_ffffffffffffeb58;
  pointer pRVar13;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1498;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1480;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1468;
  allocator_type local_144a;
  allocator_type local_1449;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1448;
  allocator_type local_1429;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1428;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1408;
  allocator_type local_13e9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_13e8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_13c8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_13b0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1398;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1378;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1358;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1338;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1320;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1308;
  vector<RPCResult,_std::allocator<RPCResult>_> local_12e8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_12c8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_12a8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1288;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1268;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1248;
  long *local_1230 [2];
  long local_1220 [2];
  long *local_1210 [2];
  long local_1200 [2];
  long *local_11f0 [2];
  long local_11e0 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_11d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11b0;
  pointer local_1190 [2];
  undefined1 local_1180 [152];
  RPCResult local_10e8;
  RPCResult local_1060;
  long *local_fd8 [2];
  long local_fc8 [2];
  long *local_fb8 [2];
  long local_fa8 [2];
  RPCResult local_f98;
  long *local_f10 [2];
  long local_f00 [2];
  long *local_ef0 [2];
  long local_ee0 [2];
  long *local_ed0 [2];
  long local_ec0 [2];
  long *local_eb0 [2];
  long local_ea0 [2];
  long *local_e90 [2];
  long local_e80 [2];
  long *local_e70 [2];
  long local_e60 [2];
  RPCResult local_e50;
  long *local_dc8 [2];
  long local_db8 [2];
  long *local_da8 [2];
  long local_d98 [2];
  long *local_d88 [2];
  long local_d78 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_d68;
  long *local_d48 [2];
  long local_d38 [2];
  pointer local_d28 [2];
  undefined1 local_d18 [152];
  RPCResult local_c80;
  long *local_bf8 [2];
  long local_be8 [2];
  long *local_bd8 [2];
  long local_bc8 [2];
  long *local_bb8 [2];
  long local_ba8 [2];
  long *local_b98 [2];
  long local_b88 [2];
  long *local_b78 [2];
  long local_b68 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_b58;
  long *local_b38 [2];
  long local_b28 [2];
  pointer local_b18 [2];
  undefined1 local_b08 [152];
  RPCResult local_a70;
  RPCResult local_9e8;
  RPCResult local_960;
  RPCResult local_8d8;
  RPCResult local_850;
  long *local_7c8 [2];
  long local_7b8 [2];
  long *local_7a8 [2];
  long local_798 [2];
  RPCResult local_788;
  long *local_700 [2];
  long local_6f0 [2];
  long *local_6e0 [2];
  long local_6d0 [2];
  long *local_6c0 [2];
  long local_6b0 [2];
  long *local_6a0 [2];
  long local_690 [2];
  long *local_680 [2];
  long local_670 [2];
  long *local_660 [2];
  long local_650 [2];
  long *local_640 [2];
  long local_630 [2];
  long *local_620 [2];
  long local_610 [2];
  long *local_600 [2];
  long local_5f0 [2];
  long *local_5e0 [2];
  long local_5d0 [2];
  long *local_5c0 [2];
  long local_5b0 [2];
  long *local_5a0 [2];
  long local_590 [2];
  long *local_580 [2];
  long local_570 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_560;
  long *local_540 [2];
  long local_530 [2];
  pointer local_520 [2];
  undefined1 local_510 [152];
  RPCResult local_478;
  RPCResult local_3f0;
  RPCResult local_368;
  RPCResult local_2e0;
  RPCResult local_258;
  RPCResult local_1d0;
  RPCResult local_148;
  RPCResult local_c0;
  vector<RPCResult,_std::allocator<RPCResult>_> *local_38;
  
  local_1060.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38 = *(vector<RPCResult,_std::allocator<RPCResult>_> **)(in_FS_OFFSET + 0x28);
  local_520[0] = (pointer)local_510;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_520,"txid","");
  local_540[0] = local_530;
  pcVar1 = (txid_field_doc->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_540,pcVar1,pcVar1 + txid_field_doc->_M_string_length);
  local_1248.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1248.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1248.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._4_28_ = in_stack_ffffffffffffeb0c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb08;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_ffffffffffffeb50;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_ffffffffffffeb48;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffeb58;
  RPCResult::RPCResult
            ((RPCResult *)(local_510 + 0x10),STR_HEX,m_key_name,in_stack_ffffffffffffeb28,inner,
             SUB81(local_520,0));
  local_560.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_560.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_560,"hash","");
  local_580[0] = local_570;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_580,"The transaction hash (differs from txid for witness transactions)"
             ,"");
  local_1268.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1268.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1268.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._4_28_ = in_stack_ffffffffffffeb0c;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb08;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb50;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb48;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb58;
  RPCResult::RPCResult
            (&local_478,STR_HEX,m_key_name_00,in_stack_ffffffffffffeb28,inner_00,SUB81(&local_560,0)
            );
  local_5a0[0] = local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5a0,"size","");
  local_5c0[0] = local_5b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5c0,"The serialized transaction size","");
  local_1288.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1288.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1288.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._4_28_ = in_stack_ffffffffffffeb0c;
  m_key_name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb08;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb50;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb48;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb58;
  RPCResult::RPCResult
            (&local_3f0,NUM,m_key_name_01,in_stack_ffffffffffffeb28,inner_01,SUB81(local_5a0,0));
  local_5e0[0] = local_5d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"vsize","");
  local_600[0] = local_5f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_600,
             "The virtual transaction size (differs from size for witness transactions)","");
  local_12a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_12a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._4_28_ = in_stack_ffffffffffffeb0c;
  m_key_name_02._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb08;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb50;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb48;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb58;
  RPCResult::RPCResult
            (&local_368,NUM,m_key_name_02,in_stack_ffffffffffffeb28,inner_02,SUB81(local_5e0,0));
  local_620[0] = local_610;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"weight","");
  local_640[0] = local_630;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_640,"The transaction\'s weight (between vsize*4-3 and vsize*4)","");
  local_12c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_12c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._4_28_ = in_stack_ffffffffffffeb0c;
  m_key_name_03._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb08;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb50;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb48;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb58;
  RPCResult::RPCResult
            (&local_2e0,NUM,m_key_name_03,in_stack_ffffffffffffeb28,inner_03,SUB81(local_620,0));
  local_660[0] = local_650;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_660,"version","");
  local_680[0] = local_670;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_680,"The version","");
  local_12e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_12e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_04._4_28_ = in_stack_ffffffffffffeb0c;
  m_key_name_04._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb08;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb50;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb48;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb58;
  RPCResult::RPCResult
            (&local_258,NUM,m_key_name_04,in_stack_ffffffffffffeb28,inner_04,SUB81(local_660,0));
  local_6a0[0] = local_690;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6a0,"locktime","");
  local_6c0[0] = local_6b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6c0,"The lock time","");
  local_1308.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1308.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1308.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_05._4_28_ = in_stack_ffffffffffffeb0c;
  m_key_name_05._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb08;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb50;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb48;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb58;
  RPCResult::RPCResult
            (&local_1d0,NUM_TIME,m_key_name_05,in_stack_ffffffffffffeb28,inner_05,SUB81(local_6a0,0)
            );
  local_6e0[0] = local_6d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6e0,"vin","");
  local_700[0] = local_6f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_700,"");
  local_7a8[0] = local_798;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7a8,"");
  local_7c8[0] = local_7b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"");
  local_b18[0] = (pointer)local_b08;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b18,"coinbase","");
  local_b38[0] = local_b28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b38,"The coinbase value (only if coinbase transaction)","");
  local_1358.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1358.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1358.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar3._28_4_ = 0;
  auVar3._0_28_ = in_stack_ffffffffffffeb0c;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb50;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb48;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb58;
  RPCResult::RPCResult
            ((RPCResult *)(local_b08 + 0x10),STR_HEX,(string)(auVar3 << 0x20),SUB81(local_b18,0),
             in_stack_ffffffffffffeb28,inner_06,true);
  local_b58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_b58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b58,"txid","");
  local_b78[0] = local_b68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b78,"The transaction id (if not coinbase transaction)","");
  local_1378.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1378.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1378.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar4._28_4_ = 0;
  auVar4._0_28_ = in_stack_ffffffffffffeb0c;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb50;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb48;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb58;
  RPCResult::RPCResult
            (&local_a70,STR_HEX,(string)(auVar4 << 0x20),SUB81(&local_b58,0),
             in_stack_ffffffffffffeb28,inner_07,true);
  local_b98[0] = local_b88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b98,"vout","");
  local_bb8[0] = local_ba8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_bb8,"The output number (if not coinbase transaction)","");
  local_1398.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1398.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1398.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar10 = 0;
  auVar5._28_4_ = 0;
  auVar5._0_28_ = in_stack_ffffffffffffeb0c;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb50;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb48;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb58;
  RPCResult::RPCResult
            (&local_9e8,NUM,(string)(auVar5 << 0x20),SUB81(local_b98,0),in_stack_ffffffffffffeb28,
             inner_08,true);
  local_bd8[0] = local_bc8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_bd8,"scriptSig","");
  local_bf8[0] = local_be8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_bf8,"The script (if not coinbase transaction)","");
  local_d28[0] = (pointer)local_d18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"asm","");
  local_d48[0] = local_d38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d48,"Disassembly of the signature script","");
  local_13c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_13c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_06._4_28_ = in_stack_ffffffffffffeb0c;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar10;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb50;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb48;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb58;
  RPCResult::RPCResult
            ((RPCResult *)(local_d18 + 0x10),STR,m_key_name_06,in_stack_ffffffffffffeb28,inner_09,
             SUB81(local_d28,0));
  local_d68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_d68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d68,"hex","");
  local_d88[0] = local_d78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d88,"The raw signature script bytes, hex-encoded","");
  local_13e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_13e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_07._4_28_ = in_stack_ffffffffffffeb0c;
  m_key_name_07._M_dataplus._M_p._0_4_ = uVar10;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb50;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb48;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb58;
  RPCResult::RPCResult
            (&local_c80,STR_HEX,m_key_name_07,in_stack_ffffffffffffeb28,inner_10,SUB81(&local_d68,0)
            );
  __l._M_len = 2;
  __l._M_array = (iterator)(local_d18 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_13b0,__l,&local_13e9);
  uVar10 = 0;
  auVar6._28_4_ = 0;
  auVar6._0_28_ = in_stack_ffffffffffffeb0c;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb50;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb48;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb58;
  RPCResult::RPCResult
            (&local_960,OBJ,(string)(auVar6 << 0x20),SUB81(local_bd8,0),in_stack_ffffffffffffeb28,
             inner_11,true);
  local_da8[0] = local_d98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_da8,"txinwitness","");
  local_dc8[0] = local_db8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_dc8,"");
  local_e70[0] = local_e60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e70,"hex","");
  local_e90[0] = local_e80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e90,"hex-encoded witness data (if any)","");
  local_1428.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1428.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1428.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_08._4_28_ = in_stack_ffffffffffffeb0c;
  m_key_name_08._M_dataplus._M_p._0_4_ = uVar10;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb50;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb48;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb58;
  RPCResult::RPCResult
            (&local_e50,STR_HEX,m_key_name_08,in_stack_ffffffffffffeb28,inner_12,SUB81(local_e70,0))
  ;
  __l_00._M_len = 1;
  __l_00._M_array = &local_e50;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1408,__l_00,&local_1429);
  uVar10 = 0;
  auVar7._28_4_ = 0;
  auVar7._0_28_ = in_stack_ffffffffffffeb0c;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb50;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb48;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb58;
  RPCResult::RPCResult
            (&local_8d8,ARR,(string)(auVar7 << 0x20),SUB81(local_da8,0),in_stack_ffffffffffffeb28,
             inner_13,true);
  local_eb0[0] = local_ea0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_eb0,"sequence","");
  local_ed0[0] = local_ec0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ed0,"The script sequence number","");
  local_1448.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1448.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1448.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_09._4_28_ = in_stack_ffffffffffffeb0c;
  m_key_name_09._M_dataplus._M_p._0_4_ = uVar10;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb50;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb48;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb58;
  RPCResult::RPCResult
            (&local_850,NUM,m_key_name_09,in_stack_ffffffffffffeb28,inner_14,SUB81(local_eb0,0));
  __l_01._M_len = 6;
  __l_01._M_array = (iterator)(local_b08 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1338,__l_01,&local_1449);
  m_key_name_10._4_28_ = in_stack_ffffffffffffeb0c;
  m_key_name_10._M_dataplus._M_p._0_4_ = uVar10;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb50;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb48;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb58;
  RPCResult::RPCResult
            (&local_788,OBJ,m_key_name_10,in_stack_ffffffffffffeb28,inner_15,SUB81(local_7a8,0));
  __l_02._M_len = 1;
  __l_02._M_array = &local_788;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1320,__l_02,&local_144a);
  m_key_name_11._4_28_ = in_stack_ffffffffffffeb0c;
  m_key_name_11._M_dataplus._M_p._0_4_ = uVar10;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb50;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb48;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb58;
  RPCResult::RPCResult
            (&local_148,ARR,m_key_name_11,in_stack_ffffffffffffeb28,inner_16,SUB81(local_6e0,0));
  local_ef0[0] = local_ee0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ef0,"vout","");
  local_f10[0] = local_f00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f10,"");
  local_fb8[0] = local_fa8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fb8,"");
  local_fd8[0] = local_fc8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fd8,"");
  local_1190[0] = (pointer)local_1180;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1190,"value","");
  std::operator+(&local_11b0,"The value in ",&CURRENCY_UNIT_abi_cxx11_);
  local_1498.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1498.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1498.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_12._4_28_ = in_stack_ffffffffffffeb0c;
  m_key_name_12._M_dataplus._M_p._0_4_ = uVar10;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb50;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb48;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb58;
  RPCResult::RPCResult
            ((RPCResult *)(local_1180 + 0x10),STR_AMOUNT,m_key_name_12,in_stack_ffffffffffffeb28,
             inner_17,SUB81(local_1190,0));
  local_11d0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_11d0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_11d0,"n","");
  local_11f0[0] = local_11e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_11f0,"index","");
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  pRVar13 = (pointer)0x0;
  m_key_name_13._4_28_ = in_stack_ffffffffffffeb0c;
  m_key_name_13._M_dataplus._M_p._0_4_ = uVar10;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult
            (&local_10e8,NUM,m_key_name_13,in_stack_ffffffffffffeb28,inner_18,SUB81(&local_11d0,0));
  local_1210[0] = local_1200;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1210,"scriptPubKey","");
  local_1230[0] = local_1220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1230);
  ScriptPubKeyDoc();
  m_key_name_14._4_28_ = in_stack_ffffffffffffeb0c;
  m_key_name_14._M_dataplus._M_p._0_4_ = uVar10;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar12;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar11;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = pRVar13;
  RPCResult::RPCResult
            (&local_1060,OBJ,m_key_name_14,in_stack_ffffffffffffeb28,inner_19,SUB81(local_1210,0));
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)(local_1180 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1480,__l_03,(allocator_type *)&stack0xffffffffffffeb2f);
  m_key_name_15._4_28_ = in_stack_ffffffffffffeb0c;
  m_key_name_15._M_dataplus._M_p._0_4_ = uVar10;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar12;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar11;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = pRVar13;
  RPCResult::RPCResult
            (&local_f98,OBJ,m_key_name_15,in_stack_ffffffffffffeb28,inner_20,SUB81(local_fb8,0));
  __l_04._M_len = 1;
  __l_04._M_array = &local_f98;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1468,__l_04,(allocator_type *)&stack0xffffffffffffeb2e);
  m_key_name_16._4_28_ = in_stack_ffffffffffffeb0c;
  m_key_name_16._M_dataplus._M_p._0_4_ = uVar10;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar12;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar11;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = pRVar13;
  RPCResult::RPCResult
            (&local_c0,ARR,m_key_name_16,in_stack_ffffffffffffeb28,inner_21,SUB81(local_ef0,0));
  __l_05._M_len = 9;
  __l_05._M_array = (iterator)(local_510 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (__return_storage_ptr__,__l_05,(allocator_type *)&stack0xffffffffffffeb2d);
  lVar9 = 0x4c8;
  do {
    if ((long *)(local_510 + lVar9) != *(long **)((long)local_520 + lVar9)) {
      operator_delete(*(long **)((long)local_520 + lVar9),*(long *)(local_510 + lVar9) + 1);
    }
    if ((long *)((long)local_530 + lVar9) != *(long **)((long)local_540 + lVar9)) {
      operator_delete(*(long **)((long)local_540 + lVar9),*(long *)((long)local_530 + lVar9) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_560.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar9));
    if ((long *)((long)local_570 + lVar9) != *(long **)((long)local_580 + lVar9)) {
      operator_delete(*(long **)((long)local_580 + lVar9),*(long *)((long)local_570 + lVar9) + 1);
    }
    lVar9 = lVar9 + -0x88;
  } while (lVar9 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1468);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f98.m_cond._M_dataplus._M_p != &local_f98.m_cond.field_2) {
    operator_delete(local_f98.m_cond._M_dataplus._M_p,
                    local_f98.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f98.m_description._M_dataplus._M_p != &local_f98.m_description.field_2) {
    operator_delete(local_f98.m_description._M_dataplus._M_p,
                    local_f98.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_f98.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f98.m_key_name._M_dataplus._M_p != &local_f98.m_key_name.field_2) {
    operator_delete(local_f98.m_key_name._M_dataplus._M_p,
                    local_f98.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1480);
  lVar9 = 0x198;
  do {
    if ((long *)(local_1180 + lVar9) != *(long **)((long)local_1190 + lVar9)) {
      operator_delete(*(long **)((long)local_1190 + lVar9),*(long *)(local_1180 + lVar9) + 1);
    }
    plVar8 = (long *)((long)local_1190 + lVar9 + -0x10);
    plVar2 = *(long **)((long)&local_11b0._M_dataplus._M_p + lVar9);
    if (plVar8 != plVar2) {
      operator_delete(plVar2,*plVar8 + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_11d0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + lVar9));
    if ((long *)((long)local_11e0 + lVar9) != *(long **)((long)local_11f0 + lVar9)) {
      operator_delete(*(long **)((long)local_11f0 + lVar9),*(long *)((long)local_11e0 + lVar9) + 1);
    }
    lVar9 = lVar9 + -0x88;
  } while (lVar9 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeb30);
  if (local_1230[0] != local_1220) {
    operator_delete(local_1230[0],local_1220[0] + 1);
  }
  if (local_1210[0] != local_1200) {
    operator_delete(local_1210[0],local_1200[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeb48);
  if (local_11f0[0] != local_11e0) {
    operator_delete(local_11f0[0],local_11e0[0] + 1);
  }
  if (local_11d0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_11d0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + 0x10U)) {
    operator_delete(local_11d0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_11d0.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11b0._M_dataplus._M_p != &local_11b0.field_2) {
    operator_delete(local_11b0._M_dataplus._M_p,local_11b0.field_2._M_allocated_capacity + 1);
  }
  if (local_1190[0] != (pointer)local_1180) {
    operator_delete(local_1190[0],local_1180._0_8_ + 1);
  }
  if (local_fd8[0] != local_fc8) {
    operator_delete(local_fd8[0],local_fc8[0] + 1);
  }
  if (local_fb8[0] != local_fa8) {
    operator_delete(local_fb8[0],local_fa8[0] + 1);
  }
  if (local_f10[0] != local_f00) {
    operator_delete(local_f10[0],local_f00[0] + 1);
  }
  if (local_ef0[0] != local_ee0) {
    operator_delete(local_ef0[0],local_ee0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1320);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788.m_cond._M_dataplus._M_p != &local_788.m_cond.field_2) {
    operator_delete(local_788.m_cond._M_dataplus._M_p,
                    local_788.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788.m_description._M_dataplus._M_p != &local_788.m_description.field_2) {
    operator_delete(local_788.m_description._M_dataplus._M_p,
                    local_788.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_788.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788.m_key_name._M_dataplus._M_p != &local_788.m_key_name.field_2) {
    operator_delete(local_788.m_key_name._M_dataplus._M_p,
                    local_788.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1338);
  lVar9 = 0x330;
  do {
    if ((long *)(local_b08 + lVar9) != *(long **)((long)local_b18 + lVar9)) {
      operator_delete(*(long **)((long)local_b18 + lVar9),*(long *)(local_b08 + lVar9) + 1);
    }
    if ((long *)((long)local_b28 + lVar9) != *(long **)((long)local_b38 + lVar9)) {
      operator_delete(*(long **)((long)local_b38 + lVar9),*(long *)((long)local_b28 + lVar9) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_b58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar9));
    if ((long *)((long)local_b68 + lVar9) != *(long **)((long)local_b78 + lVar9)) {
      operator_delete(*(long **)((long)local_b78 + lVar9),*(long *)((long)local_b68 + lVar9) + 1);
    }
    lVar9 = lVar9 + -0x88;
  } while (lVar9 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1448);
  if (local_ed0[0] != local_ec0) {
    operator_delete(local_ed0[0],local_ec0[0] + 1);
  }
  if (local_eb0[0] != local_ea0) {
    operator_delete(local_eb0[0],local_ea0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1408);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e50.m_cond._M_dataplus._M_p != &local_e50.m_cond.field_2) {
    operator_delete(local_e50.m_cond._M_dataplus._M_p,
                    local_e50.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e50.m_description._M_dataplus._M_p != &local_e50.m_description.field_2) {
    operator_delete(local_e50.m_description._M_dataplus._M_p,
                    local_e50.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_e50.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e50.m_key_name._M_dataplus._M_p != &local_e50.m_key_name.field_2) {
    operator_delete(local_e50.m_key_name._M_dataplus._M_p,
                    local_e50.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1428);
  if (local_e90[0] != local_e80) {
    operator_delete(local_e90[0],local_e80[0] + 1);
  }
  if (local_e70[0] != local_e60) {
    operator_delete(local_e70[0],local_e60[0] + 1);
  }
  if (local_dc8[0] != local_db8) {
    operator_delete(local_dc8[0],local_db8[0] + 1);
  }
  if (local_da8[0] != local_d98) {
    operator_delete(local_da8[0],local_d98[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_13b0);
  lVar9 = 0x110;
  do {
    if ((long *)(local_d18 + lVar9) != *(long **)((long)local_d28 + lVar9)) {
      operator_delete(*(long **)((long)local_d28 + lVar9),*(long *)(local_d18 + lVar9) + 1);
    }
    if ((long *)((long)local_d38 + lVar9) != *(long **)((long)local_d48 + lVar9)) {
      operator_delete(*(long **)((long)local_d48 + lVar9),*(long *)((long)local_d38 + lVar9) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_d68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar9));
    if ((long *)((long)local_d78 + lVar9) != *(long **)((long)local_d88 + lVar9)) {
      operator_delete(*(long **)((long)local_d88 + lVar9),*(long *)((long)local_d78 + lVar9) + 1);
    }
    lVar9 = lVar9 + -0x88;
  } while (lVar9 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_13e8);
  if (local_d88[0] != local_d78) {
    operator_delete(local_d88[0],local_d78[0] + 1);
  }
  if (local_d68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_d68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_d68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_d68.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_13c8);
  if (local_d48[0] != local_d38) {
    operator_delete(local_d48[0],local_d38[0] + 1);
  }
  if (local_d28[0] != (pointer)local_d18) {
    operator_delete(local_d28[0],local_d18._0_8_ + 1);
  }
  if (local_bf8[0] != local_be8) {
    operator_delete(local_bf8[0],local_be8[0] + 1);
  }
  if (local_bd8[0] != local_bc8) {
    operator_delete(local_bd8[0],local_bc8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1398);
  if (local_bb8[0] != local_ba8) {
    operator_delete(local_bb8[0],local_ba8[0] + 1);
  }
  if (local_b98[0] != local_b88) {
    operator_delete(local_b98[0],local_b88[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1378);
  if (local_b78[0] != local_b68) {
    operator_delete(local_b78[0],local_b68[0] + 1);
  }
  if (local_b58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_b58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_b58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_b58.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1358);
  if (local_b38[0] != local_b28) {
    operator_delete(local_b38[0],local_b28[0] + 1);
  }
  if (local_b18[0] != (pointer)local_b08) {
    operator_delete(local_b18[0],local_b08._0_8_ + 1);
  }
  if (local_7c8[0] != local_7b8) {
    operator_delete(local_7c8[0],local_7b8[0] + 1);
  }
  if (local_7a8[0] != local_798) {
    operator_delete(local_7a8[0],local_798[0] + 1);
  }
  if (local_700[0] != local_6f0) {
    operator_delete(local_700[0],local_6f0[0] + 1);
  }
  if (local_6e0[0] != local_6d0) {
    operator_delete(local_6e0[0],local_6d0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1308);
  if (local_6c0[0] != local_6b0) {
    operator_delete(local_6c0[0],local_6b0[0] + 1);
  }
  if (local_6a0[0] != local_690) {
    operator_delete(local_6a0[0],local_690[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_12e8);
  if (local_680[0] != local_670) {
    operator_delete(local_680[0],local_670[0] + 1);
  }
  if (local_660[0] != local_650) {
    operator_delete(local_660[0],local_650[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_12c8);
  if (local_640[0] != local_630) {
    operator_delete(local_640[0],local_630[0] + 1);
  }
  if (local_620[0] != local_610) {
    operator_delete(local_620[0],local_610[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_12a8);
  if (local_600[0] != local_5f0) {
    operator_delete(local_600[0],local_5f0[0] + 1);
  }
  if (local_5e0[0] != local_5d0) {
    operator_delete(local_5e0[0],local_5d0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1288);
  if (local_5c0[0] != local_5b0) {
    operator_delete(local_5c0[0],local_5b0[0] + 1);
  }
  if (local_5a0[0] != local_590) {
    operator_delete(local_5a0[0],local_590[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1268);
  if (local_580[0] != local_570) {
    operator_delete(local_580[0],local_570[0] + 1);
  }
  if (local_560.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_560.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_560.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_560.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1248);
  if (local_540[0] != local_530) {
    operator_delete(local_540[0],local_530[0] + 1);
  }
  if (local_520[0] != (pointer)local_510) {
    operator_delete(local_520[0],local_510._0_8_ + 1);
  }
  if (*(vector<RPCResult,_std::allocator<RPCResult>_> **)(in_FS_OFFSET + 0x28) == local_38) {
    return *(vector<RPCResult,_std::allocator<RPCResult>_> **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static std::vector<RPCResult> DecodeTxDoc(const std::string& txid_field_doc)
{
    return {
        {RPCResult::Type::STR_HEX, "txid", txid_field_doc},
        {RPCResult::Type::STR_HEX, "hash", "The transaction hash (differs from txid for witness transactions)"},
        {RPCResult::Type::NUM, "size", "The serialized transaction size"},
        {RPCResult::Type::NUM, "vsize", "The virtual transaction size (differs from size for witness transactions)"},
        {RPCResult::Type::NUM, "weight", "The transaction's weight (between vsize*4-3 and vsize*4)"},
        {RPCResult::Type::NUM, "version", "The version"},
        {RPCResult::Type::NUM_TIME, "locktime", "The lock time"},
        {RPCResult::Type::ARR, "vin", "",
        {
            {RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::STR_HEX, "coinbase", /*optional=*/true, "The coinbase value (only if coinbase transaction)"},
                {RPCResult::Type::STR_HEX, "txid", /*optional=*/true, "The transaction id (if not coinbase transaction)"},
                {RPCResult::Type::NUM, "vout", /*optional=*/true, "The output number (if not coinbase transaction)"},
                {RPCResult::Type::OBJ, "scriptSig", /*optional=*/true, "The script (if not coinbase transaction)",
                {
                    {RPCResult::Type::STR, "asm", "Disassembly of the signature script"},
                    {RPCResult::Type::STR_HEX, "hex", "The raw signature script bytes, hex-encoded"},
                }},
                {RPCResult::Type::ARR, "txinwitness", /*optional=*/true, "",
                {
                    {RPCResult::Type::STR_HEX, "hex", "hex-encoded witness data (if any)"},
                }},
                {RPCResult::Type::NUM, "sequence", "The script sequence number"},
            }},
        }},
        {RPCResult::Type::ARR, "vout", "",
        {
            {RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::STR_AMOUNT, "value", "The value in " + CURRENCY_UNIT},
                {RPCResult::Type::NUM, "n", "index"},
                {RPCResult::Type::OBJ, "scriptPubKey", "", ScriptPubKeyDoc()},
            }},
        }},
    };
}